

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_aa32_ld_i32(DisasContext_conflict1 *s,TCGv_i32 val,TCGv_i32 a32,int index,MemOp opc)

{
  TCGContext_conflict1 *tcg_ctx;
  TCGv_i64 addr;
  MemOp MVar1;
  uintptr_t o;
  
  MVar1 = opc | MO_ALIGN;
  if ((s->features >> 0x26 & 1) != 0) {
    MVar1 = opc;
  }
  tcg_ctx = s->uc->tcg_ctx;
  if (((uint)s->features >> 9 & 1) != 0) {
    opc = MVar1;
  }
  addr = gen_aa32_addr(s,a32,opc);
  tcg_gen_qemu_ld_i32_aarch64(tcg_ctx,val,addr,(ulong)(uint)index,opc);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  return;
}

Assistant:

static void gen_aa32_ld_i32(DisasContext *s, TCGv_i32 val, TCGv_i32 a32,
                            int index, MemOp opc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv addr;

    if (arm_dc_feature(s, ARM_FEATURE_M) &&
        !arm_dc_feature(s, ARM_FEATURE_M_MAIN)) {
        opc |= MO_ALIGN;
    }

    addr = gen_aa32_addr(s, a32, opc);
    tcg_gen_qemu_ld_i32(tcg_ctx, val, addr, index, opc);
    tcg_temp_free(tcg_ctx, addr);
}